

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_buildCTable_wksp
                 (HUF_CElt *CTable,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  short *psVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  HUF_CElt *pHVar7;
  uint uVar8;
  undefined4 *__s;
  long lVar9;
  char *pcVar10;
  byte *pbVar11;
  byte bVar12;
  ushort uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  short sVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  uint uVar33;
  size_t sVar34;
  nodeElt *huffNode0;
  HUF_CElt *elt;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  U16 nbPerRank [13];
  undefined4 local_bc;
  uint local_b8 [2];
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  undefined8 local_a8;
  undefined2 uStack_a0;
  undefined6 uStack_9e;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong local_78;
  ulong local_70;
  HUF_CElt *local_68;
  undefined8 local_60;
  unkbyte10 Stack_58;
  undefined6 local_4e;
  unkbyte10 Stack_48;
  ulong local_38;
  
  local_38 = wkspSize;
  __s = (undefined4 *)HUF_alignUpWorkspace(workSpace,&local_38,4);
  sVar34 = 0xffffffffffffffbe;
  if ((0x12ff < local_38) && (sVar34 = 0xffffffffffffffd2, maxSymbolValue < 0x100)) {
    uVar28 = (ulong)(maxSymbolValue + 1);
    uVar21 = 0;
    local_68 = CTable;
    memset(__s,0,0x1300);
    do {
      uVar19 = count[uVar21];
      uVar23 = 0x1f;
      if (uVar19 != 0) {
        for (; uVar19 >> uVar23 == 0; uVar23 = uVar23 - 1) {
        }
      }
      uVar23 = (uVar23 ^ 0xffffffe0) + 0xbe;
      if (uVar19 < 0xa5) {
        uVar23 = uVar19;
      }
      *(short *)(__s + (ulong)uVar23 + 0x400) = *(short *)(__s + (ulong)uVar23 + 0x400) + 1;
      uVar21 = uVar21 + 1;
    } while (uVar28 != uVar21);
    uVar19 = 0xb;
    if (maxNbBits != 0) {
      uVar19 = maxNbBits;
    }
    if (*(short *)(__s + 0x4bf) != 0) {
      __assert_fail("rankPosition[RANK_POSITION_TABLE_SIZE - 1].base == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3d40,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
    }
    lVar9 = 0x4be;
    do {
      sVar29 = *(short *)(__s + lVar9);
      *(short *)(__s + lVar9) = sVar29 + *(short *)(__s + lVar9 + 1);
      *(short *)((long)__s + lVar9 * 4 + 2) = sVar29 + *(short *)(__s + lVar9 + 1);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0x3ff);
    uVar21 = 0;
    do {
      uVar23 = count[uVar21];
      uVar24 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar24 = (uVar24 ^ 0xffffffe0) + 0xbe;
      if (uVar23 < 0xa5) {
        uVar24 = uVar23;
      }
      uVar13 = *(ushort *)((long)__s + (ulong)uVar24 * 4 + 0x1006);
      *(ushort *)((long)__s + (ulong)uVar24 * 4 + 0x1006) = uVar13 + 1;
      if ((ushort)maxSymbolValue < uVar13) {
        __assert_fail("pos < maxSymbolValue1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3d4c,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)"
                     );
      }
      __s[(ulong)uVar13 * 2 + 2] = uVar23;
      *(char *)((long)__s + (ulong)uVar13 * 8 + 0xe) = (char)uVar21;
      uVar21 = uVar21 + 1;
    } while (uVar28 != uVar21);
    lVar9 = 0x4a5;
    do {
      uVar13 = *(ushort *)(__s + lVar9);
      iVar18 = (uint)*(ushort *)((long)__s + lVar9 * 4 + 2) - (uint)uVar13;
      if (1 < iVar18) {
        if (maxSymbolValue < uVar13) {
          __assert_fail("bucketStartIdx < maxSymbolValue1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3d56,
                        "void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
        }
        HUF_simpleQuickSort((nodeElt *)(__s + (ulong)uVar13 * 2 + 2),0,iVar18 + -1);
      }
      pHVar7 = local_68;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x4bf);
    if (maxSymbolValue != 0) {
      uVar21 = 1;
      do {
        if ((uint)__s[uVar21 * 2] < (uint)__s[uVar21 * 2 + 2]) {
          __assert_fail("HUF_isSorted(huffNode, maxSymbolValue1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3d5b,
                        "void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
        }
        uVar21 = uVar21 + 1;
      } while (uVar28 != uVar21);
    }
    local_78 = (ulong)maxSymbolValue;
    lVar22 = (local_78 << 0x20) + 0x10000000000;
    lVar27 = (local_78 << 0x20) + 0x100000000;
    lVar9 = 0;
    do {
      lVar32 = lVar9 * 2;
      lVar9 = lVar9 + -1;
      lVar22 = lVar22 + -0x100000000;
      lVar27 = lVar27 + -0x100000000;
    } while (__s[local_78 * 2 + lVar32 + 2] == 0);
    __s[0x202] = __s[local_78 * 2 + lVar32 + 2] + __s[local_78 * 2 + lVar9 * 2 + 2];
    *(undefined2 *)(__s + local_78 * 2 + lVar9 * 2 + 3) = 0x100;
    *(undefined2 *)(__s + local_78 * 2 + lVar9 * 2 + 5) = 0x100;
    auVar6 = _DAT_001e9030;
    auVar5 = _DAT_001e9020;
    auVar4 = _DAT_001e8fc0;
    uVar21 = local_78 + lVar9 + 1;
    uVar25 = local_78 + lVar9 + 0x100;
    local_70 = uVar21;
    if ((long)uVar21 < 2) {
      *__s = 0x80000000;
    }
    else {
      uVar17 = (ulong)(maxSymbolValue - 1) + lVar9;
      uVar15 = 0x101;
      if (0x101 < (int)uVar25) {
        uVar15 = uVar25 & 0xffffffff;
      }
      lVar32 = uVar15 - 0x101;
      auVar35._8_4_ = (int)lVar32;
      auVar35._0_8_ = lVar32;
      auVar35._12_4_ = (int)((ulong)lVar32 >> 0x20);
      uVar16 = 0;
      auVar35 = auVar35 ^ _DAT_001e9030;
      do {
        auVar36._8_4_ = (int)uVar16;
        auVar36._0_8_ = uVar16;
        auVar36._12_4_ = (int)(uVar16 >> 0x20);
        auVar37 = (auVar36 | auVar4) ^ auVar6;
        iVar18 = auVar35._4_4_;
        if ((bool)(~(auVar37._4_4_ == iVar18 && auVar35._0_4_ < auVar37._0_4_ ||
                    iVar18 < auVar37._4_4_) & 1)) {
          __s[uVar16 * 2 + 0x204] = 0x40000000;
        }
        if ((auVar37._12_4_ != auVar35._12_4_ || auVar37._8_4_ <= auVar35._8_4_) &&
            auVar37._12_4_ <= auVar35._12_4_) {
          __s[uVar16 * 2 + 0x206] = 0x40000000;
        }
        auVar36 = (auVar36 | auVar5) ^ auVar6;
        iVar30 = auVar36._4_4_;
        if (iVar30 <= iVar18 && (iVar30 != iVar18 || auVar36._0_4_ <= auVar35._0_4_)) {
          __s[uVar16 * 2 + 0x208] = 0x40000000;
          __s[uVar16 * 2 + 0x20a] = 0x40000000;
        }
        uVar16 = uVar16 + 4;
      } while ((uVar15 - 0xfd & 0xfffffffffffffffc) != uVar16);
      *__s = 0x80000000;
      if (1 < (long)uVar21) {
        uVar15 = 0x101;
        if (0x101 < (int)uVar25) {
          uVar15 = uVar25 & 0xffffffff;
        }
        local_60 = uVar15 - 0x100;
        iVar18 = 0x100;
        lVar32 = 0;
        do {
          iVar31 = (int)uVar17;
          uVar23 = __s[(long)iVar31 * 2 + 2];
          uVar24 = __s[(long)iVar18 * 2 + 2];
          iVar30 = (iVar18 + 1) - (uint)(uVar23 < uVar24);
          iVar26 = iVar18;
          if (uVar23 < uVar24) {
            iVar26 = iVar31;
          }
          uVar8 = (uint)(uVar23 < uVar24);
          iVar20 = iVar31 - uVar8;
          uVar23 = __s[(long)iVar20 * 2 + 2];
          uVar24 = __s[(long)iVar30 * 2 + 2];
          iVar18 = (iVar30 + 1) - (uint)(uVar23 < uVar24);
          uVar17 = (ulong)((iVar31 - uVar8) - (uint)(uVar23 < uVar24));
          if (uVar23 < uVar24) {
            iVar30 = iVar20;
          }
          __s[lVar32 * 2 + 0x204] = __s[(long)iVar30 * 2 + 2] + __s[(long)iVar26 * 2 + 2];
          sVar29 = (short)lVar32 + 0x101;
          *(short *)(__s + (long)iVar30 * 2 + 3) = sVar29;
          *(short *)(__s + (long)iVar26 * 2 + 3) = sVar29;
          lVar32 = lVar32 + 1;
        } while (uVar15 - 0x100 != lVar32);
      }
    }
    *(undefined1 *)((long)__s + (lVar22 >> 0x1d) + 0xf) = 0;
    if (1 < (long)uVar21) {
      pcVar10 = (char *)((long)__s + (ulong)(maxSymbolValue + (int)lVar9 + 0xff) * 8 + 0xf);
      do {
        *pcVar10 = *(char *)((long)__s + (ulong)*(ushort *)(pcVar10 + -3) * 8 + 0xf) + '\x01';
        uVar23 = (int)uVar25 - 1;
        uVar25 = (ulong)uVar23;
        pcVar10 = pcVar10 + -8;
      } while (0x100 < (int)uVar23);
    }
    uVar25 = local_78 + lVar9 + 2;
    if (-1 < (long)uVar21) {
      uVar15 = 0;
      do {
        *(char *)((long)__s + uVar15 * 8 + 0xf) =
             *(char *)((long)__s + (ulong)*(ushort *)(__s + uVar15 * 2 + 3) * 8 + 0xf) + '\x01';
        uVar15 = uVar15 + 1;
      } while ((uVar25 & 0xffffffff) != uVar15);
    }
    bVar2 = *(byte *)((long)__s + (uVar21 & 0xffffffff) * 8 + 0xf);
    iVar18 = bVar2 - uVar19;
    uVar23 = (uint)bVar2;
    local_bc = uVar19;
    if (uVar19 <= bVar2 && iVar18 != 0) {
      bVar12 = (byte)iVar18;
      iVar18 = 1 << (bVar12 & 0x1f);
      bVar3 = *(byte *)((long)__s + (lVar27 >> 0x1d) + 0xf);
      uVar23 = (uint)bVar3;
      uVar24 = 0;
      uVar15 = uVar21;
      if (uVar19 < bVar3) {
        uVar15 = lVar27 >> 0x20;
        uVar24 = 0;
        do {
          uVar24 = uVar24 + iVar18 + (-1 << (bVar2 - (char)uVar23 & 0x1f));
          *(char *)((long)__s + uVar15 * 8 + 0xf) = (char)uVar19;
          uVar23 = (uint)*(byte *)((long)__s + uVar15 * 8 + 7);
          uVar15 = uVar15 - 1;
        } while (uVar19 < uVar23);
      }
      uVar15 = (long)(int)uVar15 + 1;
      do {
        lVar9 = uVar15 * 8;
        uVar15 = uVar15 - 1;
      } while (uVar19 == *(byte *)((long)__s + lVar9 + 7));
      if ((uVar24 & iVar18 - 1U) != 0) {
        __assert_fail("((U32)totalCost & (baseCost - 1)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3c58,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
      }
      uVar24 = (int)uVar24 >> (bVar12 & 0x1f);
      if ((int)uVar24 < 1) {
        __assert_fail("totalCost > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3c5a,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
      }
      local_88 = 0xf0f0f0f0f0f0f0f0;
      local_98 = 0xf0f0f0f0f0f0f0f0;
      uStack_90 = 0xf0f0f0f0f0f0f0f0;
      local_a8 = 0xf0f0f0f0f0f0f0f0;
      uStack_a0 = 0xf0f0;
      uStack_9e = 0xf0f0f0f0f0f0;
      local_b8[0] = 0xf0f0f0f0;
      local_b8[1] = -0xf0f0f10;
      uStack_b0 = 0xf0f0;
      uStack_ae = 0xf0f0f0f0f0f0;
      if (-1 < (long)uVar15) {
        pbVar11 = (byte *)((long)__s + (uVar15 & 0xffffffff) * 8 + 0xf);
        uVar17 = uVar15 & 0xffffffff;
        uVar23 = uVar19;
        do {
          uVar8 = (uint)uVar17;
          if (*pbVar11 < uVar23) {
            uVar23 = (uint)*pbVar11;
            local_b8[uVar19 - uVar23] = uVar8;
          }
          pbVar11 = pbVar11 + -8;
          uVar17 = (ulong)(uVar8 - 1);
        } while (0 < (int)uVar8);
      }
      do {
        uVar23 = 0x1f;
        if (uVar24 != 0) {
          for (; uVar24 >> uVar23 == 0; uVar23 = uVar23 - 1) {
          }
        }
        uVar8 = 0x20 - (uVar23 ^ 0x1f);
        if ((uVar23 ^ 0x1f) != 0x1f) {
          uVar17 = (ulong)uVar8;
          do {
            uVar16 = uVar17 - 1;
            if (((ulong)local_b8[uVar17] != 0xf0f0f0f0) &&
               ((local_b8[uVar16 & 0xffffffff] == 0xf0f0f0f0 ||
                ((uint)__s[(ulong)local_b8[uVar17] * 2 + 2] <=
                 (uint)(__s[(ulong)local_b8[uVar16 & 0xffffffff] * 2 + 2] * 2)))))
            goto LAB_00142bb4;
            uVar8 = uVar8 - 1;
            uVar17 = uVar16;
          } while ((uVar16 & 0xfffffffe) != 0);
          uVar8 = 1;
        }
LAB_00142bb4:
        uVar17 = (ulong)uVar8;
        if ((uVar8 != 1) && (local_b8[uVar17] == 0xf0f0f0f0)) {
          __assert_fail("rankLast[nBitsToDecrease] != noSymbol || nBitsToDecrease == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3c7c,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
        }
        if (uVar8 < 0xd) {
          do {
            if (local_b8[uVar17] != 0xf0f0f0f0) {
              uVar8 = (uint)uVar17;
              goto LAB_00142bea;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != 0xd);
          uVar8 = 0xd;
        }
LAB_00142bea:
        uVar23 = local_b8[uVar8];
        uVar17 = (ulong)uVar23;
        if (uVar17 == 0xf0f0f0f0) {
          __assert_fail("rankLast[nBitsToDecrease] != noSymbol",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3c80,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
        }
        uVar14 = uVar8 - 1;
        pcVar10 = (char *)((long)__s + uVar17 * 8 + 0xf);
        *pcVar10 = *pcVar10 + '\x01';
        uVar33 = uVar23;
        if (local_b8[uVar14] != 0xf0f0f0f0) {
          uVar33 = local_b8[uVar14];
        }
        local_b8[uVar14] = uVar33;
        if (uVar17 == 0) {
          uVar33 = 0xf0f0f0f0;
        }
        else {
          uVar23 = uVar23 - 1;
          local_b8[uVar8] = uVar23;
          uVar33 = 0xf0f0f0f0;
          if (uVar19 - uVar8 == (uint)*(byte *)((long)__s + (ulong)uVar23 * 8 + 0xf)) {
            uVar33 = uVar23;
          }
        }
        uVar24 = uVar24 + (-1 << ((byte)uVar14 & 0x1f));
        local_b8[uVar8] = uVar33;
      } while (0 < (int)uVar24);
      uVar23 = uVar19;
      if ((int)uVar24 < 0) {
        do {
          uVar8 = 0xffffffff;
          if (-1 < (int)uVar24) {
            uVar8 = uVar24;
          }
          iVar18 = 0;
          while (iVar30 = local_b8[1] + iVar18, iVar30 != -0xf0f0f10) {
            pcVar10 = (char *)((long)__s + (ulong)(iVar18 + local_b8[1] + 1) * 8 + 0xf);
            *pcVar10 = *pcVar10 + -1;
            iVar18 = iVar18 + 1;
            if (~uVar8 + uVar24 + iVar18 == 0) goto LAB_00142cdf;
          }
          iVar26 = (int)uVar15;
          iVar31 = uVar24 + iVar18;
          uVar15 = (long)iVar26 + 1;
          local_b8[1] = iVar26 + 2;
          do {
            lVar9 = uVar15 * 8;
            uVar15 = uVar15 - 1;
            local_b8[1] = local_b8[1] + -1;
          } while (uVar19 == *(byte *)((long)__s + lVar9 + 7));
          pcVar10 = (char *)((long)__s + (long)(int)local_b8[1] * 8 + 0xf);
          *pcVar10 = *pcVar10 + -1;
          if ((long)uVar15 < 0) {
            local_b8[1] = iVar30;
            __assert_fail("n >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x3ca8,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
          }
          uVar24 = uVar24 + iVar18 + 1;
        } while (iVar31 < -1);
      }
    }
LAB_00142cdf:
    sVar34 = 0xffffffffffffffff;
    if (uVar23 < 0xd) {
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8[0] = 0;
      local_b8[1] = 0;
      uStack_b0 = 0;
      uStack_ae = 0;
      Stack_48 = SUB1610((undefined1  [16])0x0,6);
      Stack_58 = SUB1610((undefined1  [16])0x0,0);
      local_4e = 0;
      if (-1 < (long)uVar21) {
        uVar21 = 0;
        do {
          psVar1 = (short *)((long)local_b8 + (ulong)*(byte *)((long)__s + uVar21 * 8 + 0xf) * 2);
          *psVar1 = *psVar1 + 1;
          uVar21 = uVar21 + 1;
        } while ((uVar25 & 0xffffffff) != uVar21);
      }
      sVar34 = (size_t)uVar23;
      if (uVar23 != 0) {
        lVar9 = sVar34 + 1;
        uVar13 = 0;
        do {
          *(ushort *)((long)&local_60 + lVar9 * 2 + 6) = uVar13;
          uVar13 = (ushort)(uVar13 + *(short *)((long)&local_bc + lVar9 * 2 + 2)) >> 1;
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
      elt = pHVar7 + 1;
      uVar21 = 0;
      do {
        uVar25 = (ulong)*(byte *)((long)__s + uVar21 * 8 + 0xf);
        if (0xc < uVar25) {
          __assert_fail("nbBits <= HUF_TABLELOG_ABSOLUTEMAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3bae,"void HUF_setNbBits(HUF_CElt *, size_t)");
        }
        elt[*(byte *)((long)__s + uVar21 * 8 + 0xe)] = uVar25;
        uVar21 = uVar21 + 1;
      } while (uVar28 != uVar21);
      do {
        uVar13 = *(ushort *)((long)&Stack_58 + (ulong)(byte)*elt * 2);
        *(ushort *)((long)&Stack_58 + (ulong)(byte)*elt * 2) = uVar13 + 1;
        HUF_setValue(elt,(ulong)uVar13);
        elt = elt + 1;
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
      *pHVar7 = sVar34;
    }
  }
  return sVar34;
}

Assistant:

size_t
HUF_buildCTable_wksp(HUF_CElt* CTable, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits,
                     void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables =
        (HUF_buildCTable_wksp_tables*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(U32));
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE == sizeof(HUF_buildCTable_wksp_tables));

    DEBUGLOG(5, "HUF_buildCTable_wksp (alphabet size = %u)", maxSymbolValue+1);

    /* safety checks */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
        return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
        return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);
    DEBUGLOG(6, "sorted symbols completed (%zu symbols)", showHNodeSymbols(huffNode, maxSymbolValue+1));

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* determine and enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(CTable, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}